

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidScaleLength(void)

{
  pointer pcVar1;
  ConvolutionLayerParams *pCVar2;
  long lVar3;
  Rep *pRVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  ScaleLayerParams *this_01;
  WeightParams *pWVar10;
  ostream *poVar11;
  int iVar12;
  int iVar13;
  Result res;
  Model m1;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  iVar13 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar13 + 1);
  }
  iVar13 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar13 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar13] = 1;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] != 0xf5) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xf5;
    this_01 = (ScaleLayerParams *)operator_new(0x58);
    CoreML::Specification::ScaleLayerParams::ScaleLayerParams(this_01);
    (this_00->layer_).scale_ = this_01;
  }
  pCVar2 = (this_00->layer_).convolution_;
  iVar13 = (pCVar2->kernelsize_).total_size_;
  if ((pCVar2->kernelsize_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar2->kernelsize_,iVar13 + 1);
  }
  iVar13 = (pCVar2->kernelsize_).current_size_;
  iVar12 = iVar13 + 1;
  (pCVar2->kernelsize_).current_size_ = iVar12;
  ((pCVar2->kernelsize_).rep_)->elements[iVar13] = 5;
  iVar13 = (pCVar2->kernelsize_).total_size_;
  if (iVar12 == iVar13) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar2->kernelsize_,iVar13 + 1);
  }
  iVar13 = (pCVar2->kernelsize_).current_size_;
  (pCVar2->kernelsize_).current_size_ = iVar13 + 1;
  ((pCVar2->kernelsize_).rep_)->elements[iVar13] = 5;
  iVar13 = 5;
  do {
    lVar3._0_4_ = (pCVar2->dilationfactor_).current_size_;
    lVar3._4_4_ = (pCVar2->dilationfactor_).total_size_;
    if (lVar3 == 0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      *(WeightParams **)&pCVar2->dilationfactor_ = pWVar10;
    }
    lVar3 = *(long *)&pCVar2->dilationfactor_;
    if (*(int *)(lVar3 + 0x10) == *(int *)(lVar3 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(lVar3 + 0x10),*(int *)(lVar3 + 0x14) + 1);
    }
    iVar12 = *(int *)(lVar3 + 0x10);
    *(int *)(lVar3 + 0x10) = iVar12 + 1;
    *(undefined4 *)(*(long *)(lVar3 + 0x18) + 8 + (long)iVar12 * 4) = 0x3f800000;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  iVar13 = (pCVar2->stride_).total_size_;
  if ((pCVar2->stride_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar2->stride_,iVar13 + 1);
  }
  iVar13 = (pCVar2->stride_).current_size_;
  (pCVar2->stride_).current_size_ = iVar13 + 1;
  ((pCVar2->stride_).rep_)->elements[iVar13] = 3;
  *(undefined1 *)&pCVar2->_dilationfactor_cached_byte_size_ = 1;
  iVar13 = 3;
  do {
    if ((pCVar2->dilationfactor_).rep_ == (Rep *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      (pCVar2->dilationfactor_).rep_ = (Rep *)pWVar10;
    }
    pRVar4 = (pCVar2->dilationfactor_).rep_;
    iVar12 = *(int *)((long)&pRVar4[1].arena + 4);
    if (*(int *)&pRVar4[1].arena == iVar12) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(pRVar4 + 1),iVar12 + 1);
    }
    iVar12 = *(int *)&pRVar4[1].arena;
    *(int *)&pRVar4[1].arena = iVar12 + 1;
    *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar12 * 4) = 0x3f800000;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar5 = CoreML::Result::good((Result *)local_70);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xdc1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)bVar5;
}

Assistant:

int testInvalidScaleLength() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    // shape scale needs length 1 or 3
    params->add_shapescale(num_channel);
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    params->add_shapebias(num_bias);
    params->set_hasbias(true);
    for (int i = 0; i < num_bias; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}